

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void all_stack_dump(DLword start,DLword end,DLword silent)

{
  ushort uVar1;
  DLword DVar2;
  DLword DVar3;
  int iVar4;
  LispPTR LVar5;
  DLword *pDVar6;
  int temp_3;
  int temp_2;
  int temp_1;
  int temp;
  int sdlines;
  DLword size;
  DLword *orig68k;
  DLword *end68k;
  DLword *start68k;
  STKH *stkptr;
  DLword silent_local;
  DLword end_local;
  DLword start_local;
  
  temp_1 = 0;
  if (start == 0) {
    end68k = Stackspace + (int)(uint)InterfacePage->stackbase;
  }
  else {
    end68k = NativeAligned2FromStackOffset(start);
  }
  if (end == 0) {
    orig68k = Stackspace + (int)(uint)InterfacePage->endofstack;
  }
  else {
    orig68k = NativeAligned2FromStackOffset(end);
  }
  start68k = end68k;
LAB_0015a4c6:
  do {
    while( true ) {
      pDVar6 = start68k;
      if (orig68k <= start68k) {
        printf("\n<< That\'s All , last stack :0x%x >>\n",(ulong)InterfacePage->endofstack);
        return;
      }
      uVar1 = *(ushort *)((ulong)start68k ^ 2) >> 0xd;
      if (uVar1 != 5) break;
LAB_0015a509:
      if (((*(ushort *)((ulong)start68k ^ 2) >> 8 & 0x1f) == 0) &&
         ((*(ushort *)((ulong)start68k ^ 2) & 0xff) == 0)) {
        uVar1 = *(ushort *)((ulong)(start68k + 1) ^ 2);
        if (*(ushort *)((ulong)start68k ^ 2) >> 0xd == 7) {
          LVar5 = LAddrFromNative(start68k);
          printf("\n0x%x GUARD, size : 0x%x",(ulong)LVar5,(ulong)uVar1);
        }
        else {
          LVar5 = LAddrFromNative(start68k);
          printf("\n0x%x FSB,   size : 0x%x",(ulong)LVar5,(ulong)uVar1);
        }
        if ((uVar1 != 0) && ((long)(ulong)uVar1 <= (long)orig68k - (long)start68k >> 1)) {
          temp_1 = temp_1 + 1;
          if (0x1e < temp_1) {
            printf("\nPress Return:(to quit Esc and Ret):");
            iVar4 = getchar();
            fflush(_stdin);
            temp_1 = 0;
            if (iVar4 == 0x1b) {
              longjmp((__jmp_buf_tag *)SD_jumpbuf,1);
            }
          }
          temp._2_2_ = *(ushort *)((ulong)(start68k + 1) ^ 2);
          goto LAB_0015a635;
        }
      }
LAB_0015a9de:
      temp_1 = temp_1 + 1;
      if (0x1e < temp_1) {
        printf("\nPress Return:(to quit Esc and Ret):");
        iVar4 = getchar();
        fflush(_stdin);
        temp_1 = 0;
        if (iVar4 == 0x1b) {
          longjmp((__jmp_buf_tag *)SD_jumpbuf,1);
        }
      }
      LVar5 = LAddrFromNative(start68k);
      printf("\n0x%x: Invalid, %x %x",(ulong)LVar5,(ulong)*(ushort *)((ulong)start68k ^ 2),
             (ulong)*(ushort *)((ulong)(start68k + 2) ^ 2));
LAB_0015aa68:
      start68k = start68k + 2;
    }
    if (uVar1 == 6) {
      if (silent == 0) {
        dump_fx((frameex1 *)start68k);
      }
      else {
        temp_1 = temp_1 + 1;
        if (0x1e < temp_1) {
          printf("\nPress Return:(to quit Esc and Ret):");
          iVar4 = getchar();
          fflush(_stdin);
          temp_1 = 0;
          if (iVar4 == 0x1b) {
            longjmp((__jmp_buf_tag *)SD_jumpbuf,1);
          }
        }
        LVar5 = LAddrFromNative(start68k);
        printf("\n0x%x: FX for ",(ulong)LVar5);
        LVar5 = get_framename((frameex1 *)start68k);
        print(LVar5);
        printf(" [");
        if ((start68k[1] >> 0xc & 1) != 0) {
          printf("fast,");
        }
        if ((start68k[1] >> 10 & 1) != 0) {
          printf("incall,");
        }
        if ((start68k[1] >> 9 & 1) != 0) {
          printf("V,");
        }
        if ((start68k[1] >> 8 & 1) != 0) {
          printf("nopush,");
        }
        printf("]");
      }
      if (start68k == MachineState.pvar + -10) {
        printf(" <-***current***");
        temp._2_2_ = (ushort)((long)MachineState.endofstack - (long)start68k >> 1);
      }
      else {
        pDVar6 = NativeAligned2FromStackOffset(start68k[5]);
        temp._2_2_ = (ushort)((long)pDVar6 - (long)start68k >> 1);
      }
LAB_0015a635:
      if ((temp._2_2_ == 0) || ((long)orig68k - (long)start68k >> 1 < (long)(ulong)temp._2_2_))
      goto LAB_0015a9de;
      start68k = start68k + (int)(uint)temp._2_2_;
      goto LAB_0015a4c6;
    }
    if (uVar1 == 7) goto LAB_0015a509;
    for (; *(ushort *)((ulong)start68k ^ 2) >> 0xd != 4; start68k = start68k + 2) {
      if (*(ushort *)((ulong)start68k ^ 2) >> 0xd != 0) goto LAB_0015a9de;
    }
    if ((start68k[1] >> 9 & 1) == 0) {
      DVar2 = *start68k;
      DVar3 = StackOffsetFromNative(pDVar6);
      if (DVar2 == DVar3) goto LAB_0015a8e0;
      LVar5 = LAddrFromNative(start68k);
      printf("\n$$$BF doesn\'t point TopIVAR:0x%x\n",(ulong)LVar5);
      goto LAB_0015aa68;
    }
    if (start68k != pDVar6) {
      LVar5 = LAddrFromNative(start68k);
      printf("\n$$$Bad BF(res):0x%x",(ulong)LVar5);
      goto LAB_0015aa68;
    }
LAB_0015a8e0:
    if (silent == 0) {
      dump_bf((Bframe *)start68k);
    }
    else {
      temp_1 = temp_1 + 1;
      if (0x1e < temp_1) {
        printf("\nPress Return:(to quit Esc and Ret):");
        iVar4 = getchar();
        fflush(_stdin);
        temp_1 = 0;
        if (iVar4 == 0x1b) {
          longjmp((__jmp_buf_tag *)SD_jumpbuf,1);
        }
      }
      LVar5 = LAddrFromNative(start68k);
      printf("\n0x%x BF,   ",(ulong)LVar5);
      putchar(0x5b);
      if ((start68k[1] >> 9 & 1) != 0) {
        printf("Res,");
      }
      if ((start68k[1] >> 8 & 1) != 0) {
        printf("Pad,");
      }
      printf("ivar : 0x%x]",(ulong)*start68k);
    }
    start68k = start68k + 2;
  } while( true );
}

Assistant:

void all_stack_dump(DLword start, DLword end, DLword silent)
/* Stack offset in DLword */
{
  STKH *stkptr;
  DLword *start68k, *end68k, *orig68k;
  DLword size;
  int sdlines = 0;

  if (start == 0)
    start68k = Stackspace + InterfacePage->stackbase;
  else
    start68k = NativeAligned2FromStackOffset(start);

  if (end == 0)
    end68k = Stackspace + InterfacePage->endofstack;
  else
    end68k = NativeAligned2FromStackOffset(end);

  stkptr = (STKH *)start68k;

  while (((DLword *)stkptr) < end68k) {
    switch (STKHPTR(stkptr)->flags1) {
      case STK_GUARD:
      case STK_FSB:
        if ((STKHPTR(stkptr)->flags2 != 0) || (STKHPTR(stkptr)->usecount != 0)) { goto badblock; }
        size = GETWORD(((DLword *)stkptr) + 1);
        if (STKHPTR(stkptr)->flags1 == STK_GUARD)
          printf("\n0x%x GUARD, size : 0x%x", LAddrFromNative(stkptr), size);
        else
          printf("\n0x%x FSB,   size : 0x%x", LAddrFromNative(stkptr), size);

        if (size <= 0 || size > ((DLword *)end68k - (DLword *)stkptr)) { goto badblock; }

        SD_morep;
        size = GETWORD(((DLword *)stkptr) + 1);
      checksize:
        if (size <= 0 || size > ((DLword *)end68k - (DLword *)stkptr)) { goto badblock; }
        stkptr = (STKH *)(((DLword *)stkptr) + size);
        break;

      case STK_FX:
        /*if((((FX *)stkptr)->pc < 24) ||
                (((FX *)stkptr)->alink==0)  ||
                 (STKHPTR(stkptr)->usecount > 31))
         {goto badblock;};*/
        if (silent) {
          SD_morep;
          printf("\n0x%x: FX for ", LAddrFromNative(stkptr));
          print(get_framename((struct frameex1 *)stkptr));
          printf(" [");
          if (((FX *)stkptr)->fast) printf("fast,");
          if (((FX *)stkptr)->incall) printf("incall,");
          if (((FX *)stkptr)->validnametable) printf("V,");
          if (((FX *)stkptr)->nopush) printf("nopush,");
          printf("]");
        } else {
          dump_fx((struct frameex1 *)stkptr);
        }

        if ((FX *)stkptr == CURRENTFX) {
          printf(" <-***current***");
          size = EndSTKP - (DLword *)stkptr;
        } else {
          size = NativeAligned2FromStackOffset(((FX *)stkptr)->nextblock) - (DLword *)stkptr;
        }
        goto checksize;
      default:
        orig68k = (DLword *)stkptr;

        while (STKHPTR(stkptr)->flags1 != STK_BF) {
          if (STKHPTR(stkptr)->flags1 != STK_NOTFLG) { goto badblock; }
          stkptr = (STKH *)(((DLword *)stkptr) + DLWORDSPER_CELL);
        }

        if ((BFRAMEPTR(stkptr))->residual) {
          if ((DLword *)stkptr != orig68k) {
            printf("\n$$$Bad BF(res):0x%x", LAddrFromNative(stkptr));
            goto incptr;
          }
        } else {
          if (BFRAMEPTR(stkptr)->ivar != StackOffsetFromNative(orig68k)) {
            printf("\n$$$BF doesn't point TopIVAR:0x%x\n", LAddrFromNative(stkptr));
            goto incptr;
          }
        }

        if (silent) {
          SD_morep;
          printf("\n0x%x BF,   ", LAddrFromNative(stkptr));
          putchar('[');
          if (BFRAMEPTR(stkptr)->residual) printf("Res,");
          if (BFRAMEPTR(stkptr)->padding) printf("Pad,");
          printf("ivar : 0x%x]", BFRAMEPTR(stkptr)->ivar);
        } else
          dump_bf((Bframe *)stkptr);

        stkptr = (STKH *)(((DLword *)stkptr) + 2);
        break;

      badblock:
        SD_morep;
        printf("\n0x%x: Invalid, %x %x", LAddrFromNative(stkptr), GETWORD((DLword *)stkptr),
               GETWORD((DLword *)(stkptr + 1)));
      incptr:
        stkptr = (STKH *)(((DLword *)stkptr) + 2);
        break;

    } /* case end */

  } /* while end */
  printf("\n<< That's All , last stack :0x%x >>\n", InterfacePage->endofstack);
}